

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O1

void lzma_mf_bt3_skip(lzma_mf *mf,uint32_t amount)

{
  uint uVar1;
  uint32_t cur_match;
  uint8_t *puVar2;
  uint32_t *puVar3;
  uint uVar4;
  uint32_t pos;
  uint len_limit;
  uint uVar5;
  
  do {
    uVar1 = mf->read_pos;
    uVar4 = mf->write_pos - uVar1;
    len_limit = mf->nice_len;
    if ((uVar4 < mf->nice_len) &&
       ((uVar4 < 3 || (len_limit = uVar4, mf->action == LZMA_SYNC_FLUSH)))) {
      if (mf->action == LZMA_RUN) {
        __assert_fail("mf->action != LZMA_RUN",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                      ,0x2ce,"void lzma_mf_bt3_skip(lzma_mf *, uint32_t)");
      }
      move_pending(mf);
    }
    else {
      puVar2 = mf->buffer;
      puVar3 = mf->hash;
      pos = mf->offset + uVar1;
      uVar5 = (uint)puVar2[(ulong)uVar1 + 1] ^ lzma_crc32_table[0][puVar2[uVar1]];
      uVar4 = (((uint)puVar2[(ulong)uVar1 + 2] << 8 ^ uVar5) & mf->hash_mask) + 0x400;
      cur_match = puVar3[uVar4];
      puVar3[uVar5 & 0x3ff] = pos;
      puVar3[uVar4] = pos;
      bt_skip_func(len_limit,pos,puVar2 + uVar1,cur_match,mf->depth,mf->son,mf->cyclic_pos,
                   mf->cyclic_size);
      move_pos(mf);
    }
    amount = amount - 1;
  } while (amount != 0);
  return;
}

Assistant:

extern void
lzma_mf_bt3_skip(lzma_mf *mf, uint32_t amount)
{
	do {
		const uint8_t *cur;
		uint32_t pos;
		uint32_t temp, hash_value, hash_2_value; /* hash_3_calc */
		uint32_t cur_match;

		header_skip(true, 3);

		hash_3_calc();

		cur_match = mf->hash[FIX_3_HASH_SIZE + hash_value];

		mf->hash[hash_2_value] = pos;
		mf->hash[FIX_3_HASH_SIZE + hash_value] = pos;

		bt_skip();

	} while (--amount != 0);
}